

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void SUNDlsMat_DenseMatvec(SUNDlsMat A,realtype *x,realtype *y)

{
  uint uVar1;
  uint uVar2;
  realtype **pprVar3;
  realtype *prVar4;
  ulong uVar5;
  ulong uVar6;
  
  pprVar3 = A->cols;
  uVar1 = A->M;
  uVar2 = A->N;
  if (0 < (int)uVar1) {
    memset(y,0,(ulong)uVar1 * 8);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      if (0 < (int)uVar1) {
        prVar4 = pprVar3[uVar5];
        uVar6 = 0;
        do {
          y[uVar6] = prVar4[uVar6] * x[uVar5] + y[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void SUNDlsMat_DenseMatvec(SUNDlsMat A, realtype *x, realtype *y)
{
  SUNDlsMat_denseMatvec(A->cols, x, y, A->M, A->N);
}